

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermission_parse.cpp
# Opt level: O0

void __thiscall
FIntermissionActionScroller::FIntermissionActionScroller(FIntermissionActionScroller *this)

{
  FIntermissionActionScroller *this_local;
  
  FIntermissionAction::FIntermissionAction(&this->super_FIntermissionAction);
  (this->super_FIntermissionAction)._vptr_FIntermissionAction =
       (_func_int **)&PTR__FIntermissionActionScroller_009ec948;
  FString::FString(&this->mSecondPic);
  (this->super_FIntermissionAction).mSize = 0x78;
  (this->super_FIntermissionAction).mClass = DIntermissionScreenScroller::RegistrationInfo.MyClass;
  this->mScrollDelay = 0;
  this->mScrollTime = 0x280;
  this->mScrollDir = 1;
  return;
}

Assistant:

FIntermissionActionScroller::FIntermissionActionScroller()
{
	mSize = sizeof(FIntermissionActionScroller);
	mClass = RUNTIME_CLASS(DIntermissionScreenScroller);
	mScrollDelay = 0;
	mScrollTime = 640;
	mScrollDir = SCROLL_Right;
}